

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Designator_PDU::Decode(Designator_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Designator_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x58) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_DesignatingEntityID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16CodeName);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_DesignatedEntityID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Code);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Power);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32WaveLength);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_SpotRegardsToEntity).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_SpotLocation).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8DeadReckoningAlgorithm);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding2);
  DATA_TYPE::operator>>(pKVar2,&(this->m_EntityLinearAcceleration).super_DataTypeBase);
  return;
}

Assistant:

void Designator_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DESIGNATOR_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_DesignatingEntityID
           >> m_ui16CodeName
           >> KDIS_STREAM m_DesignatedEntityID
           >> m_ui16Code
           >> m_f32Power
           >> m_f32WaveLength
           >> KDIS_STREAM m_SpotRegardsToEntity
           >> KDIS_STREAM m_SpotLocation
           >> m_ui8DeadReckoningAlgorithm
           >> m_ui16Padding1
           >> m_ui8Padding2
           >> KDIS_STREAM m_EntityLinearAcceleration;
}